

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxid.h
# Opt level: O2

void __thiscall
soplex::
SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::left4(SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        *this,int n,SPxId id)

{
  int iVar1;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar2;
  pointer pnVar3;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pUVar4;
  long lVar5;
  cpp_dec_float<200U,_int,_void> *pcVar6;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar7;
  cpp_dec_float<200U,_int,_void> *pcVar8;
  pointer pnVar9;
  ulong uVar10;
  byte bVar11;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_3;
  cpp_dec_float<200U,_int,_void> local_1b8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  beta_q;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  rhov_1;
  
  bVar11 = 0;
  if (id.super_DataKey.info != 0) {
    pSVar2 = (this->
             super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thesolver;
    local_1b8.fpclass = cpp_dec_float_finite;
    local_1b8.prec_elem = 0x1c;
    local_1b8.data._M_elems[0] = 0;
    local_1b8.data._M_elems[1] = 0;
    local_1b8.data._M_elems[2] = 0;
    local_1b8.data._M_elems[3] = 0;
    local_1b8.data._M_elems[4] = 0;
    local_1b8.data._M_elems[5] = 0;
    local_1b8.data._M_elems[6] = 0;
    local_1b8.data._M_elems[7] = 0;
    local_1b8.data._M_elems[8] = 0;
    local_1b8.data._M_elems[9] = 0;
    local_1b8.data._M_elems[10] = 0;
    local_1b8.data._M_elems[0xb] = 0;
    local_1b8.data._M_elems[0xc] = 0;
    local_1b8.data._M_elems[0xd] = 0;
    local_1b8.data._M_elems[0xe] = 0;
    local_1b8.data._M_elems[0xf] = 0;
    local_1b8.data._M_elems[0x10] = 0;
    local_1b8.data._M_elems[0x11] = 0;
    local_1b8.data._M_elems[0x12] = 0;
    local_1b8.data._M_elems[0x13] = 0;
    local_1b8.data._M_elems[0x18] = 0;
    local_1b8.data._M_elems[0x19] = 0;
    local_1b8.data._M_elems._104_5_ = 0;
    local_1b8.data._M_elems[0x1b]._1_3_ = 0;
    local_1b8.exp = 0;
    local_1b8.neg = false;
    local_1b8.data._M_elems[0x14] = 0;
    local_1b8.data._M_elems[0x15] = 0;
    local_1b8.data._M_elems[0x16] = 0;
    local_1b8.data._M_elems[0x17] = 0;
    pnVar3 = (pSVar2->theFvec->thedelta).
             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    rhov_1.m_backend.fpclass = cpp_dec_float_finite;
    rhov_1.m_backend.prec_elem = 0x1c;
    rhov_1.m_backend.data._M_elems[0] = 0;
    rhov_1.m_backend.data._M_elems[1] = 0;
    rhov_1.m_backend.data._M_elems[2] = 0;
    rhov_1.m_backend.data._M_elems[3] = 0;
    rhov_1.m_backend.data._M_elems[4] = 0;
    rhov_1.m_backend.data._M_elems[5] = 0;
    rhov_1.m_backend.data._M_elems[6] = 0;
    rhov_1.m_backend.data._M_elems[7] = 0;
    rhov_1.m_backend.data._M_elems[8] = 0;
    rhov_1.m_backend.data._M_elems[9] = 0;
    rhov_1.m_backend.data._M_elems[10] = 0;
    rhov_1.m_backend.data._M_elems[0xb] = 0;
    rhov_1.m_backend.data._M_elems[0xc] = 0;
    rhov_1.m_backend.data._M_elems[0xd] = 0;
    rhov_1.m_backend.data._M_elems[0xe] = 0;
    rhov_1.m_backend.data._M_elems[0xf] = 0;
    rhov_1.m_backend.data._M_elems[0x18] = 0;
    rhov_1.m_backend.data._M_elems[0x19] = 0;
    rhov_1.m_backend.data._M_elems._104_5_ = 0;
    rhov_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    rhov_1.m_backend.exp = 0;
    rhov_1.m_backend.neg = false;
    rhov_1.m_backend.data._M_elems[0x10] = 0;
    rhov_1.m_backend.data._M_elems[0x11] = 0;
    rhov_1.m_backend.data._M_elems[0x12] = 0;
    rhov_1.m_backend.data._M_elems[0x13] = 0;
    rhov_1.m_backend.data._M_elems[0x14] = 0;
    rhov_1.m_backend.data._M_elems[0x15] = 0;
    rhov_1.m_backend.data._M_elems[0x16] = 0;
    rhov_1.m_backend.data._M_elems[0x17] = 0;
    beta_q.m_backend.data._M_elems[0] = 1;
    beta_q.m_backend.data._M_elems[1] = 0;
    boost::multiprecision::default_ops::
    eval_divide_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,long_long>
              (&rhov_1.m_backend,(longlong *)&beta_q,&pnVar3[n].m_backend);
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::length2((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)&result_3.m_backend,
              &((this->
                super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thesolver)->theCoPvec->thedelta);
    result_1.m_backend.fpclass = cpp_dec_float_finite;
    result_1.m_backend.prec_elem = 0x1c;
    result_1.m_backend.data._M_elems[0] = 0;
    result_1.m_backend.data._M_elems[1] = 0;
    result_1.m_backend.data._M_elems[2] = 0;
    result_1.m_backend.data._M_elems[3] = 0;
    result_1.m_backend.data._M_elems[4] = 0;
    result_1.m_backend.data._M_elems[5] = 0;
    result_1.m_backend.data._M_elems[6] = 0;
    result_1.m_backend.data._M_elems[7] = 0;
    result_1.m_backend.data._M_elems[8] = 0;
    result_1.m_backend.data._M_elems[9] = 0;
    result_1.m_backend.data._M_elems[10] = 0;
    result_1.m_backend.data._M_elems[0xb] = 0;
    result_1.m_backend.data._M_elems[0xc] = 0;
    result_1.m_backend.data._M_elems[0xd] = 0;
    result_1.m_backend.data._M_elems[0xe] = 0;
    result_1.m_backend.data._M_elems[0xf] = 0;
    result_1.m_backend.data._M_elems[0x10] = 0;
    result_1.m_backend.data._M_elems[0x11] = 0;
    result_1.m_backend.data._M_elems[0x12] = 0;
    result_1.m_backend.data._M_elems[0x13] = 0;
    result_1.m_backend.data._M_elems[0x14] = 0;
    result_1.m_backend.data._M_elems[0x15] = 0;
    result_1.m_backend.data._M_elems[0x16] = 0;
    result_1.m_backend.data._M_elems[0x17] = 0;
    result_1.m_backend.data._M_elems[0x18] = 0;
    result_1.m_backend.data._M_elems[0x19] = 0;
    result_1.m_backend.data._M_elems._104_5_ = 0;
    result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    result_1.m_backend.exp = 0;
    result_1.m_backend.neg = false;
    boost::multiprecision::default_ops::
    eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
              (&result_1.m_backend,&result_3.m_backend,&rhov_1.m_backend);
    beta_q.m_backend.fpclass = cpp_dec_float_finite;
    beta_q.m_backend.prec_elem = 0x1c;
    beta_q.m_backend.data._M_elems[0] = 0;
    beta_q.m_backend.data._M_elems[1] = 0;
    beta_q.m_backend.data._M_elems[2] = 0;
    beta_q.m_backend.data._M_elems[3] = 0;
    beta_q.m_backend.data._M_elems[4] = 0;
    beta_q.m_backend.data._M_elems[5] = 0;
    beta_q.m_backend.data._M_elems[6] = 0;
    beta_q.m_backend.data._M_elems[7] = 0;
    beta_q.m_backend.data._M_elems[8] = 0;
    beta_q.m_backend.data._M_elems[9] = 0;
    beta_q.m_backend.data._M_elems[10] = 0;
    beta_q.m_backend.data._M_elems[0xb] = 0;
    beta_q.m_backend.data._M_elems[0xc] = 0;
    beta_q.m_backend.data._M_elems[0xd] = 0;
    beta_q.m_backend.data._M_elems[0xe] = 0;
    beta_q.m_backend.data._M_elems[0xf] = 0;
    beta_q.m_backend.data._M_elems[0x10] = 0;
    beta_q.m_backend.data._M_elems[0x11] = 0;
    beta_q.m_backend.data._M_elems[0x12] = 0;
    beta_q.m_backend.data._M_elems[0x13] = 0;
    beta_q.m_backend.data._M_elems[0x14] = 0;
    beta_q.m_backend.data._M_elems[0x15] = 0;
    beta_q.m_backend.data._M_elems[0x16] = 0;
    beta_q.m_backend.data._M_elems[0x17] = 0;
    beta_q.m_backend.data._M_elems[0x18] = 0;
    beta_q.m_backend.data._M_elems[0x19] = 0;
    beta_q.m_backend.data._M_elems._104_5_ = 0;
    beta_q.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    beta_q.m_backend.exp = 0;
    beta_q.m_backend.neg = false;
    boost::multiprecision::default_ops::
    eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
              (&beta_q.m_backend,&result_1.m_backend,&rhov_1.m_backend);
    pUVar4 = ((this->
              super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).thesolver)->theFvec;
    uVar10 = (ulong)(uint)(pUVar4->thedelta).super_IdxSet.num;
    while (0 < (int)uVar10) {
      iVar1 = (pUVar4->thedelta).super_IdxSet.idx[uVar10 - 1];
      uVar10 = uVar10 - 1;
      pcVar6 = &pnVar3[iVar1].m_backend;
      result_3.m_backend.fpclass = cpp_dec_float_finite;
      result_3.m_backend.prec_elem = 0x1c;
      result_3.m_backend.data._M_elems[0] = 0;
      result_3.m_backend.data._M_elems[1] = 0;
      result_3.m_backend.data._M_elems[2] = 0;
      result_3.m_backend.data._M_elems[3] = 0;
      result_3.m_backend.data._M_elems[4] = 0;
      result_3.m_backend.data._M_elems[5] = 0;
      result_3.m_backend.data._M_elems[6] = 0;
      result_3.m_backend.data._M_elems[7] = 0;
      result_3.m_backend.data._M_elems[8] = 0;
      result_3.m_backend.data._M_elems[9] = 0;
      result_3.m_backend.data._M_elems[10] = 0;
      result_3.m_backend.data._M_elems[0xb] = 0;
      result_3.m_backend.data._M_elems[0xc] = 0;
      result_3.m_backend.data._M_elems[0xd] = 0;
      result_3.m_backend.data._M_elems[0xe] = 0;
      result_3.m_backend.data._M_elems[0xf] = 0;
      result_3.m_backend.data._M_elems[0x10] = 0;
      result_3.m_backend.data._M_elems[0x11] = 0;
      result_3.m_backend.data._M_elems[0x12] = 0;
      result_3.m_backend.data._M_elems[0x13] = 0;
      result_3.m_backend.data._M_elems[0x14] = 0;
      result_3.m_backend.data._M_elems[0x15] = 0;
      result_3.m_backend.data._M_elems[0x16] = 0;
      result_3.m_backend.data._M_elems[0x17] = 0;
      result_3.m_backend.data._M_elems[0x18] = 0;
      result_3.m_backend.data._M_elems[0x19] = 0;
      result_3.m_backend.data._M_elems._104_5_ = 0;
      result_3.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      result_3.m_backend.exp = 0;
      result_3.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (&result_3.m_backend,pcVar6,pcVar6);
      result_1.m_backend.fpclass = cpp_dec_float_finite;
      result_1.m_backend.prec_elem = 0x1c;
      result_1.m_backend.data._M_elems[0] = 0;
      result_1.m_backend.data._M_elems[1] = 0;
      result_1.m_backend.data._M_elems[2] = 0;
      result_1.m_backend.data._M_elems[3] = 0;
      result_1.m_backend.data._M_elems[4] = 0;
      result_1.m_backend.data._M_elems[5] = 0;
      result_1.m_backend.data._M_elems[6] = 0;
      result_1.m_backend.data._M_elems[7] = 0;
      result_1.m_backend.data._M_elems[8] = 0;
      result_1.m_backend.data._M_elems[9] = 0;
      result_1.m_backend.data._M_elems[10] = 0;
      result_1.m_backend.data._M_elems[0xb] = 0;
      result_1.m_backend.data._M_elems[0xc] = 0;
      result_1.m_backend.data._M_elems[0xd] = 0;
      result_1.m_backend.data._M_elems[0xe] = 0;
      result_1.m_backend.data._M_elems[0xf] = 0;
      result_1.m_backend.data._M_elems[0x10] = 0;
      result_1.m_backend.data._M_elems[0x11] = 0;
      result_1.m_backend.data._M_elems[0x12] = 0;
      result_1.m_backend.data._M_elems[0x13] = 0;
      result_1.m_backend.data._M_elems[0x14] = 0;
      result_1.m_backend.data._M_elems[0x15] = 0;
      result_1.m_backend.data._M_elems[0x16] = 0;
      result_1.m_backend.data._M_elems[0x17] = 0;
      result_1.m_backend.data._M_elems[0x18] = 0;
      result_1.m_backend.data._M_elems[0x19] = 0;
      result_1.m_backend.data._M_elems._104_5_ = 0;
      result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      result_1.m_backend.exp = 0;
      result_1.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (&result_1.m_backend,&result_3.m_backend,&beta_q.m_backend);
      pcVar6 = &result_1.m_backend;
      pcVar8 = &local_1b8;
      for (lVar5 = 0x1c; lVar5 != 0; lVar5 = lVar5 + -1) {
        (pcVar8->data)._M_elems[0] = (pcVar6->data)._M_elems[0];
        pcVar6 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar6 + (ulong)bVar11 * -8 + 4);
        pcVar8 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar8 + (ulong)bVar11 * -8 + 4);
      }
      local_1b8.exp = result_1.m_backend.exp;
      local_1b8.neg = result_1.m_backend.neg;
      local_1b8.fpclass = result_1.m_backend.fpclass;
      local_1b8.prec_elem = result_1.m_backend.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                (&(pSVar2->coWeights).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[iVar1].m_backend,&local_1b8);
    }
    pnVar3 = (pSVar2->coWeights).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pnVar7 = &beta_q;
    pnVar9 = pnVar3 + n;
    for (lVar5 = 0x1c; lVar5 != 0; lVar5 = lVar5 + -1) {
      (pnVar9->m_backend).data._M_elems[0] = (pnVar7->m_backend).data._M_elems[0];
      pnVar7 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)((long)pnVar7 + ((ulong)bVar11 * -2 + 1) * 4);
      pnVar9 = (pointer)((long)pnVar9 + ((ulong)bVar11 * -2 + 1) * 4);
    }
    pnVar3[n].m_backend.exp = beta_q.m_backend.exp;
    pnVar3[n].m_backend.neg = beta_q.m_backend.neg;
    pnVar3[n].m_backend.fpclass = beta_q.m_backend.fpclass;
    pnVar3[n].m_backend.prec_elem = beta_q.m_backend.prec_elem;
  }
  return;
}

Assistant:

inline bool isValid() const
   {
      return info != 0;
   }